

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_UInt tt_cmap6_char_index(TT_CMap cmap,FT_UInt32 char_code)

{
  FT_Byte *pFVar1;
  uint uVar2;
  FT_UInt idx;
  FT_UInt count;
  FT_UInt start;
  FT_Byte *p;
  FT_UInt result;
  FT_Byte *table;
  FT_UInt32 char_code_local;
  TT_CMap cmap_local;
  
  pFVar1 = cmap->data;
  p._4_4_ = 0;
  uVar2 = char_code - CONCAT11(pFVar1[6],pFVar1[7]);
  if (uVar2 < CONCAT11(pFVar1[8],pFVar1[9])) {
    p._4_4_ = (uint)CONCAT11(pFVar1[(ulong)(uVar2 * 2) + 10],(pFVar1 + (ulong)(uVar2 * 2) + 10)[1]);
  }
  return p._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  tt_cmap6_char_index( TT_CMap    cmap,
                       FT_UInt32  char_code )
  {
    FT_Byte*  table  = cmap->data;
    FT_UInt   result = 0;
    FT_Byte*  p      = table + 6;
    FT_UInt   start  = TT_NEXT_USHORT( p );
    FT_UInt   count  = TT_NEXT_USHORT( p );
    FT_UInt   idx    = (FT_UInt)( char_code - start );


    if ( idx < count )
    {
      p += 2 * idx;
      result = TT_PEEK_USHORT( p );
    }

    return result;
  }